

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O2

void trt_pose::parse::paf_score_graph_out_hw
               (float *score_graph,float *paf_i,float *paf_j,int counts_a,int counts_b,
               float *peaks_a,float *peaks_b,int H,int W,int M,int num_integral_samples)

{
  undefined1 auVar1 [16];
  float fVar2;
  ulong uVar3;
  int iVar4;
  int t;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int unaff_R13D;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int iVar15;
  int iVar16;
  
  uVar8 = 0;
  iVar4 = num_integral_samples;
  if (num_integral_samples < 1) {
    iVar4 = 0;
  }
  uVar6 = (ulong)(uint)counts_b;
  if (counts_b < 1) {
    uVar6 = uVar8;
  }
  uVar3 = (ulong)(uint)counts_a;
  if (counts_a < 1) {
    uVar3 = uVar8;
  }
  for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
    fVar9 = (float)*(undefined8 *)(peaks_a + uVar8 * 2) * (float)H;
    fVar10 = (float)((ulong)*(undefined8 *)(peaks_a + uVar8 * 2) >> 0x20) * (float)W;
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      fVar11 = (float)*(undefined8 *)(peaks_b + uVar7 * 2) * (float)H - fVar9;
      fVar12 = (float)((ulong)*(undefined8 *)(peaks_b + uVar7 * 2) >> 0x20) * (float)W - fVar10;
      fVar2 = SQRT(fVar11 * fVar11 + fVar12 * fVar12) + 1e-05;
      fVar13 = 0.0;
      for (iVar5 = 0; iVar4 != iVar5; iVar5 = iVar5 + 1) {
        fVar14 = (float)iVar5 / ((float)num_integral_samples + -1.0);
        iVar15 = (int)(fVar14 * fVar11 + fVar9);
        iVar16 = (int)(fVar14 * fVar12 + fVar10);
        auVar1._4_4_ = -(uint)(iVar16 < W);
        auVar1._0_4_ = -(uint)(iVar15 < H);
        auVar1._8_4_ = -(uint)(-1 < iVar15);
        auVar1._12_4_ = -(uint)(-1 < iVar16);
        unaff_R13D = movmskps(unaff_R13D,auVar1);
        if (unaff_R13D == 0xf) {
          unaff_R13D = iVar15 * W;
          fVar13 = fVar13 + paf_i[(uint)(iVar16 + unaff_R13D)] * (fVar11 / fVar2) +
                            paf_j[(uint)(iVar16 + unaff_R13D)] * (fVar12 / fVar2);
        }
      }
      score_graph[uVar8 * (long)M + uVar7] = fVar13 / (float)num_integral_samples;
    }
  }
  return;
}

Assistant:

void paf_score_graph_out_hw(float *score_graph, // MxM
                            const float *paf_i, // HxW
                            const float *paf_j, // HxW
                            const int counts_a, const int counts_b,
                            const float *peaks_a, // Mx2
                            const float *peaks_b, // Mx2
                            const int H, const int W, const int M,
                            const int num_integral_samples) {
  for (int a = 0; a < counts_a; a++) {
    // compute point A
    float pa_i = peaks_a[a * 2] * H;
    float pa_j = peaks_a[a * 2 + 1] * W;

    for (int b = 0; b < counts_b; b++) {
      // compute point B
      float pb_i = peaks_b[b * 2] * H;
      float pb_j = peaks_b[b * 2 + 1] * W;

      // compute vector A->B
      float pab_i = pb_i - pa_i;
      float pab_j = pb_j - pa_j;

      // compute normalized vector A->B
      float pab_norm = sqrtf(pab_i * pab_i + pab_j * pab_j) + EPS;
      float uab_i = pab_i / pab_norm;
      float uab_j = pab_j / pab_norm;

      float integral = 0.;
      float increment = 1.f / num_integral_samples;

      for (int t = 0; t < num_integral_samples; t++) {
        // compute integral point T
        float progress = (float)t / ((float)num_integral_samples - 1);
        float pt_i = pa_i + progress * pab_i;
        float pt_j = pa_j + progress * pab_j;

        // convert to int
        // note: we do not need to subtract 0.5 when indexing, because
        // round(x - 0.5) = int(x)
        int pt_i_int = (int)pt_i;
        int pt_j_int = (int)pt_j;

        // skip point if out of bounds (will weaken integral)
        if (pt_i_int < 0)
          continue;
        if (pt_i_int >= H)
          continue;
        if (pt_j_int < 0)
          continue;
        if (pt_j_int >= W)
          continue;

        // get vector at integral point from PAF
        float pt_paf_i = paf_i[pt_i_int * W + pt_j_int];
        float pt_paf_j = paf_j[pt_i_int * W + pt_j_int];

        // compute dot product of normalized A->B with PAF vector at integral
        // point
        float dot = pt_paf_i * uab_i + pt_paf_j * uab_j;
        integral += dot;
      }

      integral /= num_integral_samples;
      score_graph[a * M + b] = integral;
    }
  }
}